

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.cpp
# Opt level: O2

double __thiscall entropy::calcEntropy(entropy *this)

{
  int __x;
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int l;
  long lVar5;
  __type _Var6;
  double dVar7;
  
  iVar1 = this->n;
  _Var6 = std::log<int>(iVar1);
  dVar7 = _Var6 * (double)iVar1;
  iVar1 = this->position_box_count;
  for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
      iVar1 = this->velocity_box_count;
      for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
        for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
          __x = *(int *)(*(long *)(*(long *)(*(long *)&(this->boxes).
                                                                                                              
                                                  super__Vector_base<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                                  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                                  ._M_impl + lVar2 * 0x18) + lVar4 * 0x18) +
                        lVar5 * 4);
          if (0 < __x) {
            _Var6 = std::log<int>(__x);
            dVar7 = dVar7 - _Var6 * (double)__x;
            iVar1 = this->velocity_box_count;
          }
        }
      }
      iVar1 = this->position_box_count;
    }
  }
  return dVar7;
}

Assistant:

double entropy::calcEntropy()
{
    //int n = particles.size();
    int ns = 0;
    double res = n * log(n);
    for (int i = 0; i < position_box_count; i++)
    {
        for (int j = 0; j < position_box_count; j++)
        {
            for (int k = 0; k < velocity_box_count; k++)
            {
                for (int l = 0; l < velocity_box_count; l++)
                {
                    ns = boxes[i][j][k][l];
                    if (ns > 0)
                    {
                        res -= ns * log(ns);
                    }
                }
            }
        }
    }
    return res;
}